

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O2

int ask_user_int(char *szPrompt,int iDefault)

{
  long lVar1;
  char enter [30];
  
  enter[0x10] = '\0';
  enter[0x11] = '\0';
  enter[0x12] = '\0';
  enter[0x13] = '\0';
  enter[0x14] = '\0';
  enter[0x15] = '\0';
  enter[0x16] = '\0';
  enter[0x17] = '\0';
  enter[0x18] = '\0';
  enter[0x19] = '\0';
  enter[0x1a] = '\0';
  enter[0x1b] = '\0';
  enter[0x1c] = '\0';
  enter[0x1d] = '\0';
  enter[0] = '\0';
  enter[1] = '\0';
  enter[2] = '\0';
  enter[3] = '\0';
  enter[4] = '\0';
  enter[5] = '\0';
  enter[6] = '\0';
  enter[7] = '\0';
  enter[8] = '\0';
  enter[9] = '\0';
  enter[10] = '\0';
  enter[0xb] = '\0';
  enter[0xc] = '\0';
  enter[0xd] = '\0';
  enter[0xe] = '\0';
  enter[0xf] = '\0';
  printf("%s <%d>: ",szPrompt,iDefault);
  fgets(enter,0x1d,_stdin);
  if ((enter[0] != '\0') && (enter[0] != '\n')) {
    lVar1 = strtol(enter,(char **)0x0,10);
    iDefault = (int)lVar1;
  }
  return iDefault;
}

Assistant:

int
ask_user_int (const char* szPrompt, int iDefault)
{
    char    enter[30] = "";
    printf("%s <%d>: ", szPrompt, iDefault);
    fgets(enter, sizeof(enter)-1, stdin);
    if('\0' == enter[0] || '\n' == enter[0])
        return iDefault;
    return strtol(enter, NULL, 10);
}